

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>::Evaluate
          (string *__return_storage_ptr__,
          TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagChecker)

{
  pointer pbVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  size_type *psVar7;
  GeneratorExpressionContent *content_00;
  string result;
  cmTarget *target;
  string name;
  string local_b8;
  string local_98;
  cmTarget *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pbVar1 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (pbVar1->_M_dataplus)._M_p;
  content_00 = content;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + pbVar1->_M_string_length);
  bVar4 = cmGeneratorExpression::IsValidTargetName(&local_50);
  if (bVar4) {
    local_78 = cmMakefile::FindTargetToUse(context->Makefile,&local_50,false);
    if (local_78 == (cmTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
      std::operator+(&local_70,"No target \"",&local_50);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98.field_2._8_8_ = plVar6[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_98._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      reportError(context,&local_b8,&local_98);
    }
    else {
      if (local_78->TargetTypeValue == UNKNOWN_LIBRARY || (int)local_78->TargetTypeValue < 4) {
        if (dagChecker != (cmGeneratorExpressionDAGChecker *)0x0) {
          bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                            (dagChecker,local_50._M_dataplus._M_p);
          if (bVar4) {
LAB_0038c7e9:
            GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Expressions which require the linker language may not be used while evaluating link libraries"
                       ,"");
            reportError(context,&local_b8,&local_98);
            goto LAB_0038c863;
          }
          bVar4 = cmGeneratorExpressionDAGChecker::EvaluatingSources(dagChecker);
          if (bVar4) {
            cmGeneratorExpressionDAGChecker::TopTarget_abi_cxx11_(&local_b8,dagChecker);
            _Var3._M_p = local_b8._M_dataplus._M_p;
            if (local_50._M_string_length == local_b8._M_string_length) {
              if (local_50._M_string_length == 0) {
                bVar4 = true;
              }
              else {
                iVar5 = bcmp(local_50._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                             local_50._M_string_length);
                bVar4 = iVar5 == 0;
              }
            }
            else {
              bVar4 = false;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p != &local_b8.field_2) {
              operator_delete(_Var3._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            if (bVar4) goto LAB_0038c7e9;
          }
        }
        std::
        _Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
        ::_M_insert_unique<cmTarget*const&>
                  ((_Rb_tree<cmTarget*,cmTarget*,std::_Identity<cmTarget*>,std::less<cmTarget*>,std::allocator<cmTarget*>>
                    *)&context->DependTargets,&local_78);
        std::
        _Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
        ::_M_insert_unique<cmTarget_const*const&>
                  ((_Rb_tree<cmTarget_const*,cmTarget_const*,std::_Identity<cmTarget_const*>,std::less<cmTarget_const*>,std::allocator<cmTarget_const*>>
                    *)&context->AllTargets,&local_78);
        TargetFilesystemArtifactResultCreator<ArtifactSonameTag>::Create_abi_cxx11_
                  (&local_b8,(TargetFilesystemArtifactResultCreator<ArtifactSonameTag> *)local_78,
                   (cmTarget *)context,(cmGeneratorExpressionContext *)content,content_00);
        if (context->HadError == true) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__return_storage_ptr__,local_b8._M_dataplus._M_p,
                     local_b8._M_dataplus._M_p + local_b8._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0038c9eb;
      }
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
      std::operator+(&local_70,"Target \"",&local_50);
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      psVar7 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98.field_2._8_8_ = plVar6[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *psVar7;
        local_98._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_98._M_string_length = plVar6[1];
      *plVar6 = (long)psVar7;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      reportError(context,&local_b8,&local_98);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
LAB_0038c9b5:
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_b8,content);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"Expression syntax not recognized.","");
    reportError(context,&local_b8,&local_98);
LAB_0038c863:
    local_70.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_98._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) goto LAB_0038c9b5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_0038c9eb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(const std::vector<std::string> &parameters,
                       cmGeneratorExpressionContext *context,
                       const GeneratorExpressionContent *content,
                       cmGeneratorExpressionDAGChecker *dagChecker) const
  {
    // Lookup the referenced target.
    std::string name = *parameters.begin();

    if (!cmGeneratorExpression::IsValidTargetName(name))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expression syntax not recognized.");
      return std::string();
      }
    cmTarget* target = context->Makefile->FindTargetToUse(name);
    if(!target)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "No target \"" + name + "\"");
      return std::string();
      }
    if(target->GetType() >= cmTarget::OBJECT_LIBRARY &&
      target->GetType() != cmTarget::UNKNOWN_LIBRARY)
      {
      ::reportError(context, content->GetOriginalExpression(),
                  "Target \"" + name + "\" is not an executable or library.");
      return std::string();
      }
    if (dagChecker && (dagChecker->EvaluatingLinkLibraries(name.c_str())
        || (dagChecker->EvaluatingSources()
          && name == dagChecker->TopTarget())))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "Expressions which require the linker language may not "
                    "be used while evaluating link libraries");
      return std::string();
      }
    context->DependTargets.insert(target);
    context->AllTargets.insert(target);

    std::string result =
                TargetFilesystemArtifactResultCreator<ArtifactT>::Create(
                          target,
                          context,
                          content);
    if (context->HadError)
      {
      return std::string();
      }
    return
        TargetFilesystemArtifactResultGetter<ComponentT>::Get(result);
  }